

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.h
# Opt level: O0

void pybind11::finalize_interpreter(void)

{
  internals *this;
  bool bVar1;
  PyObject *ptr;
  internals ***pppiVar2;
  bool local_99;
  item_accessor local_98;
  object local_78;
  capsule local_70;
  byte local_65;
  byte local_51;
  item_accessor local_50;
  handle local_30;
  PyObject *local_28;
  internals **local_20;
  internals **internals_ptr_ptr;
  char *id;
  handle builtins;
  
  ptr = (PyObject *)PyEval_GetBuiltins();
  handle::handle((handle *)&id,ptr);
  internals_ptr_ptr = (internals **)anon_var_dwarf_1e3ef;
  pppiVar2 = detail::get_internals_pp();
  local_20 = *pppiVar2;
  bVar1 = detail::object_api<pybind11::handle>::contains<char_const*&>
                    ((object_api<pybind11::handle> *)&id,(char **)&internals_ptr_ptr);
  local_51 = 0;
  local_65 = 0;
  local_99 = false;
  if (bVar1) {
    detail::object_api<pybind11::handle>::operator[]
              (&local_50,(object_api<pybind11::handle> *)&id,(char *)internals_ptr_ptr);
    local_51 = 1;
    detail::accessor::operator_cast_to_object((accessor *)&local_30);
    local_65 = 1;
    local_28 = local_30.m_ptr;
    local_99 = isinstance<pybind11::capsule,_0>(local_30);
  }
  if ((local_65 & 1) != 0) {
    object::~object((object *)&local_30);
  }
  if ((local_51 & 1) != 0) {
    detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_50);
  }
  if (local_99 != false) {
    detail::object_api<pybind11::handle>::operator[]
              (&local_98,(object_api<pybind11::handle> *)&id,(char *)internals_ptr_ptr);
    detail::accessor::operator_cast_to_object((accessor *)&local_78);
    capsule::capsule(&local_70,&local_78);
    local_20 = capsule::operator_cast_to_internals__(&local_70);
    capsule::~capsule(&local_70);
    object::~object(&local_78);
    detail::accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_98);
  }
  Py_Finalize();
  if (local_20 != (internals **)0x0) {
    this = *local_20;
    if (this != (internals *)0x0) {
      detail::internals::~internals(this);
      operator_delete(this,0x1d8);
    }
    *local_20 = (internals *)0x0;
  }
  return;
}

Assistant:

inline void finalize_interpreter() {
    handle builtins(PyEval_GetBuiltins());
    const char *id = PYBIND11_INTERNALS_ID;

    // Get the internals pointer (without creating it if it doesn't exist).  It's possible for the
    // internals to be created during Py_Finalize() (e.g. if a py::capsule calls `get_internals()`
    // during destruction), so we get the pointer-pointer here and check it after Py_Finalize().
    detail::internals **internals_ptr_ptr = detail::get_internals_pp();
    // It could also be stashed in builtins, so look there too:
    if (builtins.contains(id) && isinstance<capsule>(builtins[id]))
        internals_ptr_ptr = capsule(builtins[id]);

    Py_Finalize();

    if (internals_ptr_ptr) {
        delete *internals_ptr_ptr;
        *internals_ptr_ptr = nullptr;
    }
}